

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parasail_aligner.cpp
# Opt level: O0

void print_help(char *progname,int status)

{
  FILE *__stream;
  size_t sVar1;
  undefined1 auVar2 [16];
  int status_local;
  char *progname_local;
  
  fprintf(_stderr,
          "\nusage: %s [-a funcname] [-c cutoff] [-x] [-e gap_extend] [-o gap_open] [-m matrix] [-t threads] [-d] [-M match] [-X mismatch] [-k band size (for nw_banded)] [-l AOL] [-s SIM] [-i OS] [-v] [-V] -f file [-q query_file] [-g output_file] [-O output_format {EMBOSS,SAM,SAMH,SSW}] [-b batch_size] [-r memory_budget] [-C] [-A alphabet_aliases] \n\n"
          ,progname);
  __stream = _stderr;
  sVar1 = getMemorySize();
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  fprintf(__stream,
          "Defaults:\n        funcname: sw_stats_striped_16\n          cutoff: 7, must be >= 1, exact match length cutoff\n              -x: if present, don\'t use suffix array filter\n      gap_extend: 1, must be >= 0\n        gap_open: 10, must be >= 0\n          matrix: blosum62\n              -d: if present, assume DNA alphabet ACGT\n           match: 1, must be >= 0\n        mismatch: 0, must be >= 0\n      threads: Warning: ignored; OpenMP was not supported by your compiler\n             AOL: 80, must be 0 <= AOL <= 100, percent alignment length\n             SIM: 40, must be 0 <= SIM <= 100, percent exact matches\n              OS: 30, must be 0 <= OS <= 100, percent optimal score\n                                              over self score\n              -v: verbose output, report input parameters and timing\n              -V: verbose memory output, report memory use\n            file: no default, must be in FASTA format\n      query_file: no default, must be in FASTA format\n     output_file: parasail.csv\n   output_format: no default, must be one of {EMBOSS,SAM,SAMH,SSW}\n      batch_size: 0 (calculate based on memory budget),\n                  how many alignments before writing output\n   memory_budget: 2GB or half available from system query (%.3f GB)\n              -C: if present, use case sensitive alignments, matrices, etc.\nalphabet_aliases: traceback will treat these pairs of characters as matches,\n                  for example, \'TU\' for one pair, or multiple pairs as \'XYab\'\n"
          ,(((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / 2.0) * 1e-09);
  exit(status);
}

Assistant:

static void print_help(const char *progname, int status) {
    eprintf(stderr, "\nusage: %s "
            "[-a funcname] "
            "[-c cutoff] "
            "[-x] "
            "[-e gap_extend] "
            "[-o gap_open] "
            "[-m matrix] "
            "[-t threads] "
            "[-d] "
            "[-M match] "
            "[-X mismatch] "
            "[-k band size (for nw_banded)] "
            "[-l AOL] "
            "[-s SIM] "
            "[-i OS] "
            "[-v] "
            "[-V] "
            "-f file "
            "[-q query_file] "
            "[-g output_file] "
            "[-O output_format {EMBOSS,SAM,SAMH,SSW}] "
            "[-b batch_size] "
            "[-r memory_budget] "
            "[-C] "
            "[-A alphabet_aliases] "
            "\n\n",
            progname);
    eprintf(stderr, "Defaults:\n"
            "        funcname: sw_stats_striped_16\n"
            "          cutoff: 7, must be >= 1, exact match length cutoff\n"
            "              -x: if present, don't use suffix array filter\n"
            "      gap_extend: 1, must be >= 0\n"
            "        gap_open: 10, must be >= 0\n"
            "          matrix: blosum62\n"
            "              -d: if present, assume DNA alphabet ACGT\n"
            "           match: 1, must be >= 0\n"
            "        mismatch: 0, must be >= 0\n"
THREAD_DOC
            "             AOL: 80, must be 0 <= AOL <= 100, percent alignment length\n"
            "             SIM: 40, must be 0 <= SIM <= 100, percent exact matches\n"
            "              OS: 30, must be 0 <= OS <= 100, percent optimal score\n"
            "                                              over self score\n"
            "              -v: verbose output, report input parameters and timing\n"
            "              -V: verbose memory output, report memory use\n"
            "            file: no default, must be in FASTA format\n"
            "      query_file: no default, must be in FASTA format\n"
            "     output_file: parasail.csv\n"
            "   output_format: no default, must be one of {EMBOSS,SAM,SAMH,SSW}\n"
            "      batch_size: 0 (calculate based on memory budget),\n"
            "                  how many alignments before writing output\n"
            "   memory_budget: 2GB or half available from system query (%.3f GB)\n"
            "              -C: if present, use case sensitive alignments, matrices, etc.\n"
            "alphabet_aliases: traceback will treat these pairs of characters as matches,\n"
            "                  for example, 'TU' for one pair, or multiple pairs as 'XYab'\n",
        getMemorySize()/2.0*GB
            );
    exit(status);
}